

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::RegisterDataSourceRequest::RegisterDataSourceRequest
          (RegisterDataSourceRequest *this,RegisterDataSourceRequest *param_1)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__RegisterDataSourceRequest_00409898;
  protozero::CopyablePtr<perfetto::protos::gen::DataSourceDescriptor>::CopyablePtr
            (&this->data_source_descriptor_,&param_1->data_source_descriptor_);
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

RegisterDataSourceRequest::RegisterDataSourceRequest(RegisterDataSourceRequest&&) noexcept = default;